

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::PositiveConstraint::PositiveConstraint(PositiveConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::PositiveConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)0x255b78);
  std::__cxx11::string::operator=(in_RDI,"positive");
  return;
}

Assistant:

PositiveConstraint() { this->description_ = "positive"; }